

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall sf::RenderTarget::pushGLStates(RenderTarget *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = anon_unknown.dwarf_1f0127::RenderTargetImpl::isActive(this->m_id);
  if (!bVar1) {
    iVar2 = (*this->_vptr_RenderTarget[4])(this,1);
    if ((char)iVar2 == '\0') goto LAB_00162656;
  }
  (*sf_glad_glPushClientAttrib)(0xffffffff);
  (*sf_glad_glPushAttrib)(0xffffffff);
  (*sf_glad_glMatrixMode)(0x1700);
  (*sf_glad_glPushMatrix)();
  (*sf_glad_glMatrixMode)(0x1701);
  (*sf_glad_glPushMatrix)();
  (*sf_glad_glMatrixMode)(0x1702);
  (*sf_glad_glPushMatrix)();
LAB_00162656:
  resetGLStates(this);
  return;
}

Assistant:

void RenderTarget::pushGLStates()
{
    if (RenderTargetImpl::isActive(m_id) || setActive(true))
    {
        #ifdef SFML_DEBUG
            // make sure that the user didn't leave an unchecked OpenGL error
            GLenum error = glGetError();
            if (error != GL_NO_ERROR)
            {
                err() << "OpenGL error (" << error << ") detected in user code, "
                      << "you should check for errors with glGetError()"
                      << std::endl;
            }
        #endif

        #ifndef SFML_OPENGL_ES
            glCheck(glPushClientAttrib(GL_CLIENT_ALL_ATTRIB_BITS));
            glCheck(glPushAttrib(GL_ALL_ATTRIB_BITS));
        #endif
        glCheck(glMatrixMode(GL_MODELVIEW));
        glCheck(glPushMatrix());
        glCheck(glMatrixMode(GL_PROJECTION));
        glCheck(glPushMatrix());
        glCheck(glMatrixMode(GL_TEXTURE));
        glCheck(glPushMatrix());
    }

    resetGLStates();
}